

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

path * __thiscall filesystem::path::extension_abi_cxx11_(path *this)

{
  allocator local_49;
  long local_48;
  size_t pos;
  size_t *local_20;
  string *name;
  path *this_local;
  
  this_local = this;
  filename_abi_cxx11_((path *)&pos);
  local_20 = &pos;
  local_48 = std::__cxx11::string::find_last_of((char *)local_20,0x10e58c);
  if (local_48 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  else {
    std::__cxx11::string::substr((ulong)this,(ulong)local_20);
  }
  std::__cxx11::string::~string((string *)&pos);
  return this;
}

Assistant:

std::string extension() const {
        const std::string &name = filename();
        size_t pos = name.find_last_of(".");
        if (pos == std::string::npos)
            return "";
        return name.substr(pos+1);
    }